

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

Regexp * __thiscall
re2::CoalesceWalker::PostVisit
          (CoalesceWalker *this,Regexp *re,Regexp *parent_arg,Regexp *pre_arg,Regexp **child_args,
          int nchild_args)

{
  Regexp *this_00;
  bool bVar1;
  ushort uVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  ulong uVar4;
  Regexp *pRVar5;
  int iVar6;
  int i_3;
  ulong uVar7;
  Regexp **r2ptr;
  
  uVar2 = re->nsub_;
  if (uVar2 == 0) {
LAB_0012e618:
    pRVar5 = Regexp::Incref(re);
    return pRVar5;
  }
  if (re->op_ == '\x05') {
    uVar7 = 0;
    while( true ) {
      do {
        uVar4 = uVar7;
        if (uVar2 <= uVar4) {
          bVar1 = ChildArgsChanged(re,child_args);
          if (bVar1) {
            pRVar5 = (Regexp *)operator_new(0x28);
            Regexp::Regexp(pRVar5,(uint)re->op_,(uint)re->parse_flags_);
            Regexp::AllocSub(pRVar5,(uint)re->nsub_);
            if (pRVar5->nsub_ < 2) {
              paVar3 = &pRVar5->field_5;
            }
            else {
              paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar5->field_5).submany_;
            }
            uVar2 = re->nsub_;
            for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
              paVar3[uVar7] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(child_args + uVar7);
            }
            return pRVar5;
          }
          goto LAB_0012e618;
        }
        uVar7 = uVar4 + 1;
      } while (uVar2 <= uVar7);
      bVar1 = CanCoalesce(child_args[uVar4],child_args[uVar7]);
      if (bVar1) break;
      uVar2 = re->nsub_;
    }
    r2ptr = child_args + 1;
    uVar7 = 0;
    while (uVar4 = (ulong)re->nsub_, uVar7 < uVar4) {
      uVar7 = uVar7 + 1;
      if ((uVar7 < uVar4) && (bVar1 = CanCoalesce(r2ptr[-1],*r2ptr), bVar1)) {
        DoCoalesce(r2ptr + -1,r2ptr);
      }
      r2ptr = r2ptr + 1;
    }
    iVar6 = 0;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      iVar6 = iVar6 + (uint)(child_args[uVar7]->op_ == '\x02');
    }
    pRVar5 = (Regexp *)operator_new(0x28);
    Regexp::Regexp(pRVar5,(uint)re->op_,(uint)re->parse_flags_);
    Regexp::AllocSub(pRVar5,(uint)re->nsub_ - iVar6);
    if (pRVar5->nsub_ < 2) {
      paVar3 = &pRVar5->field_5;
    }
    else {
      paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar5->field_5).submany_;
    }
    iVar6 = 0;
    for (uVar7 = 0; uVar7 < re->nsub_; uVar7 = uVar7 + 1) {
      this_00 = child_args[uVar7];
      if (this_00->op_ == '\x02') {
        Regexp::Decref(this_00);
      }
      else {
        paVar3[iVar6].subone_ = this_00;
        iVar6 = iVar6 + 1;
      }
    }
  }
  else {
    bVar1 = ChildArgsChanged(re,child_args);
    if (!bVar1) goto LAB_0012e618;
    pRVar5 = (Regexp *)operator_new(0x28);
    Regexp::Regexp(pRVar5,(uint)re->op_,(uint)re->parse_flags_);
    Regexp::AllocSub(pRVar5,(uint)re->nsub_);
    if (pRVar5->nsub_ < 2) {
      paVar3 = &pRVar5->field_5;
    }
    else {
      paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar5->field_5).submany_;
    }
    uVar2 = re->nsub_;
    for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      paVar3[uVar7] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(child_args + uVar7);
    }
    if (re->op_ == '\n') {
      iVar6 = Regexp::min(re);
      (pRVar5->field_7).field_0.min_ = iVar6;
      iVar6 = Regexp::max(re);
    }
    else {
      if (re->op_ != '\v') {
        return pRVar5;
      }
      iVar6 = Regexp::cap(re);
    }
    (pRVar5->field_7).field_0.max_ = iVar6;
  }
  return pRVar5;
}

Assistant:

Regexp* CoalesceWalker::PostVisit(Regexp* re,
                                  Regexp* parent_arg,
                                  Regexp* pre_arg,
                                  Regexp** child_args,
                                  int nchild_args) {
  if (re->nsub() == 0)
    return re->Incref();

  if (re->op() != kRegexpConcat) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    // Repeats and Captures have additional data that must be copied.
    if (re->op() == kRegexpRepeat) {
      nre->min_ = re->min();
      nre->max_ = re->max();
    } else if (re->op() == kRegexpCapture) {
      nre->cap_ = re->cap();
    }
    return nre;
  }

  bool can_coalesce = false;
  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1])) {
      can_coalesce = true;
      break;
    }
  }
  if (!can_coalesce) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    return nre;
  }

  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1]))
      DoCoalesce(&child_args[i], &child_args[i+1]);
  }
  // Determine how many empty matches were left by DoCoalesce.
  int n = 0;
  for (int i = n; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch)
      n++;
  }
  // Build a new op.
  Regexp* nre = new Regexp(re->op(), re->parse_flags());
  nre->AllocSub(re->nsub() - n);
  Regexp** nre_subs = nre->sub();
  for (int i = 0, j = 0; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch) {
      child_args[i]->Decref();
      continue;
    }
    nre_subs[j] = child_args[i];
    j++;
  }
  return nre;
}